

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                    *this,Index target,Index source)

{
  Characteristic CVar1;
  Zp_field_operators<unsigned_int,_void> *this_00;
  Field_element FVar2;
  Characteristic *pCVar3;
  Field_element local_2c;
  Column *pCStack_28;
  Field_element coef;
  Column *toadd;
  Column *curr;
  Index source_local;
  Index target_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
  *this_local;
  
  curr._0_4_ = source;
  curr._4_4_ = target;
  _source_local = this;
  toadd = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::get_column(&this->reducedMatrixR_,target);
  pCStack_28 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
               ::get_column(&this->reducedMatrixR_,(Index)curr);
  local_2c = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
             ::get_pivot_value(pCStack_28);
  local_2c = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_inverse
                       (this->operators_,local_2c);
  this_00 = this->operators_;
  pCVar3 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                     (this->operators_);
  CVar1 = *pCVar3;
  FVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
          ::get_pivot_value(toadd);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (this_00,&local_2c,CVar1 - FVar2);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
  ::multiply_source_and_add(toadd,pCStack_28,&local_2c);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
  ::multiply_source_and_add_to<unsigned_int>
            (&this->mirrorMatrixU_,&local_2c,(uint *)&curr,curr._4_4_);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}